

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     VoidFinalize<duckdb::ArgMinMaxState<duckdb::string_t,int>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  long lVar1;
  idx_t iVar2;
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_40;
  
  local_40.result = result;
  local_40.input = aggr_input_data;
  if (*states == (Vector)0x2) {
    duckdb::Vector::SetVectorType((VectorType)result);
    local_40.result_idx = 0;
    VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
    ::Finalize<duckdb::ArgMinMaxState<duckdb::string_t,int>>
              ((ArgMinMaxState<duckdb::string_t,_int> *)**(undefined8 **)(states + 0x20),&local_40);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    lVar1 = *(long *)(states + 0x20);
    if (count != 0) {
      iVar2 = 0;
      do {
        local_40.result_idx = offset + iVar2;
        VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
        ::Finalize<duckdb::ArgMinMaxState<duckdb::string_t,int>>
                  (*(ArgMinMaxState<duckdb::string_t,_int> **)(lVar1 + iVar2 * 8),&local_40);
        iVar2 = iVar2 + 1;
      } while (count != iVar2);
    }
  }
  return;
}

Assistant:

static void VoidFinalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                         idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<STATE_TYPE>(**sdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<STATE_TYPE>(*sdata[i], finalize_data);
			}
		}
	}